

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

bool __thiscall
pbrt::Curve::RecursiveIntersect
          (Curve *this,Ray *ray,Float tMax,span<const_pbrt::Point3<float>_> cp,
          Transform *ObjectFromRay,Float u0,Float u1,int depth,optional<pbrt::ShapeIntersection> *si
          )

{
  float fVar1;
  Float u0_00;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  CurveCommon *pCVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  ulong uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  Point3fi pi_00;
  Vector3f dpdu;
  bool bVar23;
  Point3<float> *pPVar24;
  Point3<float> *pPVar25;
  Interval *this_00;
  long lVar26;
  SurfaceInteraction *pSVar27;
  long in_FS_OFFSET;
  undefined8 uVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar40 [48];
  undefined1 auVar38 [64];
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [56];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar54 [12];
  undefined1 auVar53 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_register_00001284 [60];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  float fVar60;
  float fVar61;
  float fVar63;
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  span<const_pbrt::Point3<float>_> cp_00;
  span<const_pbrt::Point3<float>_> cp_01;
  span<const_pbrt::Point3<float>_> cp_02;
  Point3f PVar67;
  Vector3<float> VVar68;
  Vector3f wo;
  Vector3f dpdv;
  Vector3f axis;
  undefined8 local_318;
  uint local_308;
  Tuple3<pbrt::Normal3,_float> local_2f8;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  Transform *local_2b8;
  Float local_2ac;
  Tuple3<pbrt::Vector3,_float> local_2a8;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined8 local_270;
  undefined4 local_268;
  undefined8 local_260;
  undefined4 local_258;
  undefined8 local_250;
  undefined4 local_248;
  Vector3f pError;
  Float u [3];
  Float FStack_22c;
  Interval IStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  Tuple3<pbrt::Normal3,_float> aTStack_210 [2];
  MediumInterface *local_1f8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  local_1f0;
  Tuple3<pbrt::Vector3,_float> local_1e8 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_1d0 [2];
  Tuple3<pbrt::Normal3,_float> aTStack_1b8 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_1a0 [2];
  Tuple3<pbrt::Normal3,_float> TStack_188;
  TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  local_178;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_170;
  Tuple3<pbrt::Vector3,_float> local_168 [3];
  Point3fi pi;
  SurfaceInteraction intr;
  undefined1 auVar35 [16];
  undefined1 auVar39 [64];
  
  auVar57._4_60_ = in_register_00001284;
  auVar57._0_4_ = u1;
  auVar33 = auVar57._0_16_;
  auVar58._4_60_ = in_register_00001244;
  auVar58._0_4_ = u0;
  pPVar24 = (Point3<float> *)cp.n;
  this_00 = (Interval *)cp.ptr;
  auVar40 = in_ZmmResult._16_48_;
  auVar32 = auVar58._0_16_;
  fVar42 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar43 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar41 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar42 = fVar42 * fVar42 + fVar43 * fVar43 + fVar41 * fVar41;
  pPVar25 = pPVar24;
  local_2b8 = ObjectFromRay;
  if (fVar42 < 0.0) {
    local_2e8._0_4_ = u1;
    fVar42 = sqrtf(fVar42);
    auVar33 = ZEXT416((uint)local_2e8._0_4_);
  }
  else {
    auVar30 = vsqrtss_avx(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42));
    fVar42 = auVar30._0_4_;
  }
  if (depth < 1) {
    fVar43 = this_00->low;
    fVar41 = this_00->high;
    auVar30 = vfnmadd231ss_fma(ZEXT416((uint)(fVar43 * (fVar43 - this_00[1].high))),
                               ZEXT416((uint)fVar41),ZEXT416((uint)(this_00[2].low - fVar41)));
    if (0.0 <= auVar30._0_4_) {
      fVar1 = this_00[5].low;
      fVar15 = this_00[4].high;
      auVar30 = vfnmadd231ss_fma(ZEXT416((uint)(fVar15 * (fVar15 - this_00[3].low))),
                                 ZEXT416((uint)fVar1),ZEXT416((uint)(this_00[3].high - fVar1)));
      if (0.0 <= auVar30._0_4_) {
        fVar15 = fVar15 - fVar43;
        fVar1 = fVar1 - fVar41;
        fVar61 = fVar1 * fVar1 + fVar15 * fVar15;
        if ((fVar61 != 0.0) || (NAN(fVar61))) {
          auVar30._8_4_ = 0x80000000;
          auVar30._0_8_ = 0x8000000080000000;
          auVar30._12_4_ = 0x80000000;
          auVar30 = vxorps_avx512vl(ZEXT416((uint)fVar41),auVar30);
          auVar44 = ZEXT416((uint)(fVar1 * auVar30._0_4_));
          auVar31 = vfnmadd213ss_fma(ZEXT416((uint)fVar15),ZEXT416((uint)fVar43),auVar44);
          auVar30 = vfmsub213ss_fma(ZEXT416((uint)fVar1),auVar30,auVar44);
          fVar61 = (auVar31._0_4_ + auVar30._0_4_) / fVar61;
          auVar31 = ZEXT416((uint)fVar61);
          auVar30 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar61 * auVar33._0_4_)),auVar32,
                                        ZEXT416((uint)(1.0 - fVar61)));
          auVar33 = vminss_avx(auVar33,auVar30);
          uVar28 = vcmpss_avx512f(auVar30,auVar32,1);
          bVar23 = (bool)((byte)uVar28 & 1);
          auVar39._16_48_ = auVar40;
          auVar39._0_16_ = auVar33;
          auVar38._4_60_ = auVar39._4_60_;
          auVar38._0_4_ = (float)((uint)bVar23 * (int)u0 + (uint)!bVar23 * auVar33._0_4_);
          local_288 = auVar38._0_16_;
          pCVar13 = this->common;
          local_2e8 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ * pCVar13->width[1])),
                                      ZEXT416((uint)(1.0 - auVar38._0_4_)),
                                      ZEXT416((uint)pCVar13->width[0]));
          local_2f8.x = 0.0;
          local_2f8.y = 0.0;
          local_2f8.z = 0.0;
          if (pCVar13->type == Ribbon) {
            fVar43 = pCVar13->normalAngle;
            if ((fVar43 != 0.0) || (NAN(fVar43))) {
              local_2c8._0_4_ = fVar61;
              fVar43 = sinf((1.0 - auVar38._0_4_) * fVar43);
              fVar43 = fVar43 * this->common->invSinNormalAngle;
              fVar41 = sinf((float)local_288._0_4_ * this->common->normalAngle);
              auVar31 = ZEXT416((uint)local_2c8._0_4_);
              pCVar13 = this->common;
              fVar41 = fVar41 * pCVar13->invSinNormalAngle;
              local_2f8.z = fVar43 * pCVar13->n[0].super_Tuple3<pbrt::Normal3,_float>.z +
                            fVar41 * pCVar13->n[1].super_Tuple3<pbrt::Normal3,_float>.z;
              uVar5 = pCVar13->n[0].super_Tuple3<pbrt::Normal3,_float>.x;
              uVar9 = pCVar13->n[0].super_Tuple3<pbrt::Normal3,_float>.y;
              uVar6 = pCVar13->n[1].super_Tuple3<pbrt::Normal3,_float>.x;
              uVar10 = pCVar13->n[1].super_Tuple3<pbrt::Normal3,_float>.y;
              auVar32._0_4_ = fVar43 * (float)uVar5 + fVar41 * (float)uVar6;
              auVar32._4_4_ = fVar43 * (float)uVar9 + fVar41 * (float)uVar10;
              auVar32._8_4_ = fVar43 * 0.0 + fVar41 * 0.0;
              auVar32._12_4_ = fVar43 * 0.0 + fVar41 * 0.0;
              local_2f8._0_8_ = vmovlps_avx(auVar32);
            }
            else {
              local_2f8.z = pCVar13->n[0].super_Tuple3<pbrt::Normal3,_float>.z;
              pPVar25 = (Point3<float> *)(ulong)(uint)local_2f8.z;
              local_2f8.x = pCVar13->n[0].super_Tuple3<pbrt::Normal3,_float>.x;
              local_2f8.y = pCVar13->n[0].super_Tuple3<pbrt::Normal3,_float>.y;
            }
            fVar43 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
            auVar33 = ZEXT416((uint)(local_2f8.z * fVar43));
            auVar32 = vfmadd132ss_fma(ZEXT416((uint)local_2f8.y),auVar33,
                                      ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.y));
            auVar33 = vfmsub213ss_fma(ZEXT416((uint)fVar43),ZEXT416((uint)local_2f8.z),auVar33);
            auVar32 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ + auVar33._0_4_)),
                                      ZEXT416((uint)local_2f8.x),
                                      ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x));
            auVar33._8_4_ = 0x7fffffff;
            auVar33._0_8_ = 0x7fffffff7fffffff;
            auVar33._12_4_ = 0x7fffffff;
            auVar32 = vandps_avx512vl(auVar32,auVar33);
            local_2e8 = ZEXT416((uint)(local_2e8._0_4_ * (auVar32._0_4_ / fVar42)));
          }
          local_250 = 0;
          local_248 = 0;
          auVar32 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar31);
          auVar54 = SUB6412(ZEXT864(0),0);
          uVar28 = vcmpss_avx512f(auVar31,ZEXT816(0) << 0x20,1);
          auVar52 = ZEXT856(auVar32._8_8_);
          cp_01.n = (size_t)&local_250;
          cp_01.ptr = pPVar24;
          PVar67 = EvaluateCubicBezier((pbrt *)this_00,cp_01,
                                       (Float)((uint)!(bool)((byte)uVar28 & 1) * auVar32._0_4_),
                                       (Vector3f *)pPVar25);
          fVar41 = PVar67.super_Tuple3<pbrt::Point3,_float>.z;
          auVar49._0_8_ = PVar67.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar49._8_56_ = auVar52;
          auVar30 = auVar49._0_16_;
          auVar32 = vmovshdup_avx(auVar30);
          auVar33 = vfmadd231ss_fma(ZEXT416((uint)(auVar32._0_4_ * auVar32._0_4_)),auVar30,auVar30);
          fVar43 = auVar33._0_4_;
          if (fVar43 <= (float)local_2e8._0_4_ * (float)local_2e8._0_4_ * 0.25) {
            if (fVar41 < 0.0) {
              return false;
            }
            if (fVar42 * tMax < fVar41) {
              return false;
            }
            if (si != (optional<pbrt::ShapeIntersection> *)0x0) {
              local_2c8._0_4_ = fVar41 / fVar42;
              local_2c8._4_12_ = auVar54;
              if ((si->set == true) &&
                 (*(float *)((long)&si->optionalValue + 0xf8) < (float)local_2c8._0_4_)) {
                return false;
              }
              if (fVar43 < 0.0) {
                local_2d8 = auVar30;
                fVar42 = sqrtf(fVar43);
                auVar30 = local_2d8;
              }
              else {
                auVar33 = vsqrtss_avx(auVar33,auVar33);
                fVar42 = auVar33._0_4_;
              }
              auVar32 = vfnmadd132ss_fma(auVar32,ZEXT416((uint)(auVar30._0_4_ * local_250._4_4_)),
                                         ZEXT416((uint)local_250));
              local_2a8.x = 0.0;
              local_2a8.y = 0.0;
              local_2a8.z = 0.0;
              cp_02.n = (size_t)&local_2a8;
              cp_02.ptr = (Point3<float> *)0x4;
              EvaluateCubicBezier((pbrt *)this->common->cpObj,cp_02,(Float)local_288._0_4_,
                                  (Vector3f *)pPVar25);
              intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = 0.0;
              intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = 0.0;
              intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = 0.0;
              u[0] = local_2a8.x;
              u[1] = local_2a8.y;
              uVar28 = u._0_8_;
              u[2] = local_2a8.z;
              u[0] = local_2a8.x;
              u._0_8_ = uVar28;
              if ((((u[0] == 0.0) && (!NAN(u[0]))) && (u[1] = local_2a8.y, u[1] == 0.0)) &&
                 ((local_2a8.z == 0.0 && (!NAN(local_2a8.z))))) {
                LogFatal<char_const(&)[18],char_const(&)[5],char_const(&)[18],pbrt::Vector3<float>&,char_const(&)[5],pbrt::Vector3<float>&>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes.cpp"
                           ,0x2b2,"Check failed: %s != %s with %s = %s, %s = %s",
                           (char (*) [18])"Vector3f(0, 0, 0)",(char (*) [5])"dpdu",
                           (char (*) [18])"Vector3f(0, 0, 0)",(Vector3<float> *)&intr,
                           (char (*) [5])"dpdu",(Vector3<float> *)u);
              }
              auVar44._0_4_ = fVar42 / (float)local_2e8._0_4_;
              auVar44._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar31._8_4_ = 0x80000000;
              auVar31._0_8_ = 0x8000000080000000;
              auVar31._12_4_ = 0x80000000;
              auVar33 = vxorps_avx512vl(auVar44,auVar31);
              local_308 = auVar32._0_4_;
              uVar28 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416(local_308),1);
              bVar23 = (bool)((byte)uVar28 & 1);
              fVar42 = (float)((uint)bVar23 * (int)auVar44._0_4_ + (uint)!bVar23 * auVar33._0_4_) +
                       0.5;
              auVar52 = (undefined1  [56])0x0;
              if (this->common->type == Ribbon) {
                VVar68 = Cross<float>((Normal3<float> *)&local_2f8,(Vector3<float> *)&local_2a8);
                fVar41 = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar50._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                auVar50._8_56_ = auVar52;
                auVar45._0_4_ =
                     VVar68.super_Tuple3<pbrt::Vector3,_float>.x *
                     VVar68.super_Tuple3<pbrt::Vector3,_float>.x;
                auVar45._4_4_ =
                     VVar68.super_Tuple3<pbrt::Vector3,_float>.y *
                     VVar68.super_Tuple3<pbrt::Vector3,_float>.y;
                auVar45._8_4_ = auVar52._0_4_ * auVar52._0_4_;
                auVar45._12_4_ = auVar52._4_4_ * auVar52._4_4_;
                auVar32 = vhaddps_avx(auVar45,auVar45);
                fVar43 = fVar41 * fVar41 + auVar32._0_4_;
                if (fVar43 < 0.0) {
                  local_2d8._0_4_ = fVar41;
                  fVar43 = sqrtf(fVar43);
                  fVar41 = (float)local_2d8._0_4_;
                }
                else {
                  auVar32 = vsqrtss_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43));
                  fVar43 = auVar32._0_4_;
                }
                auVar46._4_4_ = fVar43;
                auVar46._0_4_ = fVar43;
                auVar46._8_4_ = fVar43;
                auVar46._12_4_ = fVar43;
                auVar32 = vdivps_avx(auVar50._0_16_,auVar46);
                local_318 = CONCAT44((float)local_2e8._0_4_ * auVar32._4_4_,
                                     (float)local_2e8._0_4_ * auVar32._0_4_);
                local_2d8._0_4_ = (float)local_2e8._0_4_ * (fVar41 / fVar43);
              }
              else {
                VVar68 = Transform::ApplyInverse<float>(local_2b8,(Vector3<float> *)&local_2a8);
                auVar51._0_8_ = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                auVar51._8_56_ = auVar52;
                local_2d8._0_4_ = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar32 = vmovshdup_avx(auVar51._0_16_);
                auVar34._8_4_ = 0x80000000;
                auVar34._0_8_ = 0x8000000080000000;
                auVar34._12_4_ = 0x80000000;
                auVar33 = vxorps_avx512vl(auVar32,auVar34);
                fVar43 = auVar32._0_4_ * auVar32._0_4_ +
                         VVar68.super_Tuple3<pbrt::Vector3,_float>.x *
                         VVar68.super_Tuple3<pbrt::Vector3,_float>.x;
                if (fVar43 < 0.0) {
                  local_298 = auVar33;
                  fVar43 = sqrtf(fVar43);
                  auVar33 = local_298;
                }
                else {
                  auVar32 = vsqrtss_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43));
                  fVar43 = auVar32._0_4_;
                }
                auVar32 = vunpcklps_avx(auVar33,auVar51._0_16_);
                auVar47._4_4_ = fVar43;
                auVar47._0_4_ = fVar43;
                auVar47._8_4_ = fVar43;
                auVar47._12_4_ = fVar43;
                auVar32 = vdivps_avx(auVar32,auVar47);
                auVar48._0_4_ = (float)local_2e8._0_4_ * auVar32._0_4_;
                auVar48._4_4_ = (float)local_2e8._0_4_ * auVar32._4_4_;
                auVar48._8_4_ = (float)local_2e8._0_4_ * auVar32._8_4_;
                auVar48._12_4_ = (float)local_2e8._0_4_ * auVar32._12_4_;
                u[2] = (float)local_2e8._0_4_ * (0.0 / fVar43);
                u._0_8_ = vmovlps_avx(auVar48);
                if (this->common->type == Cylinder) {
                  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar42 * 90.0)),
                                            ZEXT416((uint)(1.0 - fVar42)),ZEXT416(0xc2b40000));
                  fVar43 = auVar32._0_4_ * -0.017453292;
                  fVar41 = sinf(fVar43);
                  local_298._0_4_ = fVar41;
                  fVar43 = cosf(fVar43);
                  axis.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_2d8._0_4_;
                  axis.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar51._0_8_;
                  axis.super_Tuple3<pbrt::Vector3,_float>.y =
                       (float)(int)((ulong)auVar51._0_8_ >> 0x20);
                  Rotate((Transform *)&intr,(Float)local_298._0_4_,fVar43,axis);
                  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(u[1] * intr.super_Interaction.pi.
                                                                  super_Point3<pbrt::Interval>.
                                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high)
                                                  ),ZEXT416((uint)u[0]),
                                            ZEXT416((uint)intr.super_Interaction.pi.
                                                          super_Point3<pbrt::Interval>.
                                                          super_Tuple3<pbrt::Point3,_pbrt::Interval>
                                                          .x.low));
                  auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)u[2]),
                                            ZEXT416((uint)intr.super_Interaction.pi.
                                                          super_Point3<pbrt::Interval>.
                                                          super_Tuple3<pbrt::Point3,_pbrt::Interval>
                                                          .y.low));
                  auVar33 = vfmadd231ss_fma(ZEXT416((uint)(u[1] * intr.super_Interaction.pi.
                                                                  super_Point3<pbrt::Interval>.
                                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high)
                                                  ),ZEXT416((uint)u[0]),
                                            ZEXT416((uint)intr.super_Interaction.pi.
                                                          super_Point3<pbrt::Interval>.
                                                          super_Tuple3<pbrt::Point3,_pbrt::Interval>
                                                          .z.low));
                  auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)u[2]),
                                            ZEXT416((uint)intr.super_Interaction.time));
                  auVar32 = vinsertps_avx(auVar32,auVar33,0x10);
                  auVar33 = vfmadd231ss_fma(ZEXT416((uint)(u[1] * intr.super_Interaction.wo.
                                                                  super_Tuple3<pbrt::Vector3,_float>
                                                                  .z)),ZEXT416((uint)u[0]),
                                            ZEXT416((uint)intr.super_Interaction.wo.
                                                          super_Tuple3<pbrt::Vector3,_float>.y));
                  auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)u[2]),
                                            ZEXT416((uint)intr.super_Interaction.n.
                                                          super_Tuple3<pbrt::Normal3,_float>.x));
                  u._0_8_ = vmovlps_avx(auVar32);
                  u[2] = auVar33._0_4_;
                }
                VVar68 = Transform::operator()(local_2b8,(Vector3<float> *)u);
                local_318 = VVar68.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                local_2d8._0_4_ = VVar68.super_Tuple3<pbrt::Vector3,_float>.z;
              }
              pError.super_Tuple3<pbrt::Vector3,_float>.x =
                   (float)local_2e8._0_4_ + (float)local_2e8._0_4_;
              bVar23 = this->common->reverseOrientation;
              bVar14 = this->common->transformSwapsHandedness;
              uVar7 = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
              uVar11 = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
              uVar8 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
              uVar12 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
              auVar53._0_4_ = (float)local_2c8._0_4_ * (float)uVar8 + (float)uVar7;
              auVar53._4_4_ = (float)local_2c8._0_4_ * (float)uVar12 + (float)uVar11;
              auVar53._8_4_ = (float)local_2c8._0_4_ * 0.0 + 0.0;
              auVar53._12_4_ = (float)local_2c8._0_4_ * 0.0 + 0.0;
              intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
                   (float)local_2c8._0_4_ * (ray->d).super_Tuple3<pbrt::Vector3,_float>.z +
                   (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
              intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = (Interval)vmovlps_avx(auVar53);
              pError.super_Tuple3<pbrt::Vector3,_float>.y =
                   pError.super_Tuple3<pbrt::Vector3,_float>.x;
              pError.super_Tuple3<pbrt::Vector3,_float>.z =
                   pError.super_Tuple3<pbrt::Vector3,_float>.x;
              Point3fi::Point3fi(&pi,(Point3f *)&intr,&pError);
              uVar20._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
              uVar20._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
              wo.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar20 ^ 0x8000000080000000;
              wo.super_Tuple3<pbrt::Vector3,_float>.z =
                   -(ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
              dpdu.super_Tuple3<pbrt::Vector3,_float>.z = local_2a8.z;
              dpdu.super_Tuple3<pbrt::Vector3,_float>.x = local_2a8.x;
              dpdu.super_Tuple3<pbrt::Vector3,_float>.y = local_2a8.y;
              local_260 = 0;
              local_258 = 0;
              local_270 = 0;
              local_268 = 0;
              auVar32 = vinsertps_avx(local_288,ZEXT416((uint)fVar42),0x10);
              pi_00.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
                   pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
              pi_00.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
                   pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
              pi_00.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
                   pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
              dpdv.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_2d8._0_4_;
              dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_318;
              dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_318._4_4_;
              SurfaceInteraction::SurfaceInteraction
                        (&intr,pi_00,(Point2f)auVar32._0_8_,wo,dpdu,dpdv,(Normal3f)ZEXT812(0),
                         (Normal3f)ZEXT812(0),ray->time,bVar23 != bVar14);
              Transform::operator()((SurfaceInteraction *)u,this->common->renderFromObject,&intr);
              if (si->set == true) {
                si->set = false;
              }
              *(MediumInterface **)((long)&si->optionalValue + 0x40) = local_1f8;
              (si->optionalValue).__align = (anon_struct_8_0_00000001_for___align)u._0_8_;
              *(ulong *)((long)&si->optionalValue + 8) = CONCAT44(FStack_22c,u[2]);
              *(Interval *)((long)&si->optionalValue + 0x10) = IStack_228;
              *(undefined8 *)((long)&si->optionalValue + 0x18) = uStack_220;
              *(undefined8 *)((long)&si->optionalValue + 0x20) = uStack_218;
              *(undefined8 *)((long)&si->optionalValue + 0x28) = aTStack_210[0]._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x30) = aTStack_210._8_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x38) = aTStack_210[1]._4_8_;
              ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                *)((long)&si->optionalValue + 0x48))->bits = local_1f0.bits;
              *(undefined8 *)((long)&si->optionalValue + 0x50) = local_1e8[0]._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x58) = local_1e8._8_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x60) = local_1e8[1]._4_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x68) = aTStack_1d0[0]._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x70) = aTStack_1d0._8_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x78) = aTStack_1d0[1]._4_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x80) = aTStack_1b8[0]._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x88) = aTStack_1b8._8_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x80) = aTStack_1b8[0]._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x88) = aTStack_1b8._8_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x90) = aTStack_1b8[1]._4_8_;
              *(undefined8 *)((long)&si->optionalValue + 0x98) = aTStack_1a0[0]._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0xa0) = aTStack_1a0._8_8_;
              *(undefined8 *)((long)&si->optionalValue + 0xa8) = aTStack_1a0[1]._4_8_;
              *(undefined8 *)((long)&si->optionalValue + 0xb0) = TStack_188._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0xb8) = stack0xfffffffffffffe80;
              ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
                *)((long)&si->optionalValue + 0xc0))->bits = local_178.bits;
              ((TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                *)((long)&si->optionalValue + 200))->bits = local_170.bits;
              *(undefined8 *)((long)&si->optionalValue + 0xd0) = local_168[0]._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0xd8) = local_168._8_8_;
              *(undefined8 *)((long)&si->optionalValue + 0xe0) = local_168[1]._4_8_;
              *(undefined8 *)((long)&si->optionalValue + 0xe8) = local_168[2]._0_8_;
              *(undefined8 *)((long)&si->optionalValue + 0xf0) = stack0xfffffffffffffeb8;
              *(undefined4 *)((long)&si->optionalValue + 0xf8) = local_2c8._0_4_;
              si->set = true;
            }
            *(long *)(in_FS_OFFSET + -0x568) = *(long *)(in_FS_OFFSET + -0x568) + 1;
            return true;
          }
        }
      }
    }
  }
  else {
    fVar42 = this_00[1].low;
    fVar43 = this_00[2].high;
    fVar41 = this_00[4].low;
    fVar1 = this_00[5].high;
    auVar30 = vmulss_avx512f(ZEXT416((uint)(fVar41 + fVar42 + fVar43 + fVar43)),
                             SUB6416(ZEXT464(0x3e800000),0));
    fVar18 = (float)*(undefined8 *)&this_00[1].high;
    fVar19 = (float)((ulong)*(undefined8 *)&this_00[1].high >> 0x20);
    fVar15 = (*this_00).low;
    fVar16 = (*this_00).high;
    fVar61 = (float)*(undefined8 *)&this_00[4].high;
    fVar60 = this_00[3].low;
    fVar17 = (float)((ulong)*(undefined8 *)&this_00[4].high >> 0x20);
    fVar63 = this_00[3].high;
    auVar66._0_4_ = (fVar60 + fVar61) * 0.5;
    auVar66._4_4_ = (fVar63 + fVar17) * 0.5;
    auVar66._8_8_ = 0;
    auVar65._0_4_ = (fVar60 + fVar60 + fVar18 + fVar61) * 0.25;
    auVar65._4_4_ = (fVar63 + fVar63 + fVar19 + fVar17) * 0.25;
    auVar65._8_8_ = 0;
    auVar64._0_4_ = fVar18 * 3.0 + fVar15 + fVar60 * 3.0 + fVar61;
    auVar64._4_4_ = fVar19 * 3.0 + fVar16 + fVar63 * 3.0 + fVar17;
    auVar64._8_8_ = 0;
    auVar22._8_4_ = 0x3e000000;
    auVar22._0_8_ = 0x3e0000003e000000;
    auVar22._12_4_ = 0x3e000000;
    auVar31 = vmulps_avx512vl(auVar64,auVar22);
    auVar62._0_4_ = (fVar18 + fVar18 + fVar15 + fVar60) * 0.25;
    auVar62._4_4_ = (fVar19 + fVar19 + fVar16 + fVar63) * 0.25;
    auVar62._8_8_ = 0;
    auVar59._0_4_ = (fVar15 + fVar18) * 0.5;
    auVar59._4_4_ = (fVar16 + fVar19) * 0.5;
    auVar59._8_8_ = 0;
    pSVar27 = &intr;
    intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = *this_00;
    intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = this_00[1].low;
    uVar28 = vmovlps_avx(auVar59);
    intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = (Float)uVar28;
    intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low = (Float)((ulong)uVar28 >> 0x20);
    intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high = (fVar42 + fVar43) * 0.5;
    uVar28 = vmovlps_avx(auVar62);
    intr.super_Interaction.time = (Float)uVar28;
    intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = (float)((ulong)uVar28 >> 0x20);
    intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = auVar30._0_4_;
    uVar28 = vmovlps_avx(auVar31);
    intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = (float)uVar28;
    intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)((ulong)uVar28 >> 0x20);
    intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y =
         (fVar43 * 3.0 + fVar42 + fVar41 * 3.0 + fVar1) * 0.125;
    uVar28 = vmovlps_avx(auVar65);
    intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)uVar28;
    intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)((ulong)uVar28 >> 0x20);
    intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
         (fVar43 + fVar41 + fVar41 + fVar1) * 0.25;
    uVar28 = vmovlps_avx(auVar66);
    intr.super_Interaction._60_4_ = SUB84(uVar28,0);
    intr.super_Interaction.mediumInterface._0_4_ = (undefined4)((ulong)uVar28 >> 0x20);
    intr.super_Interaction.mediumInterface._4_4_ = (fVar41 + fVar1) * 0.5;
    intr.super_Interaction.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits._0_4_ = (undefined4)*(undefined8 *)&this_00[4].high;
    intr.super_Interaction.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits._4_4_ = (undefined4)((ulong)*(undefined8 *)&this_00[4].high >> 0x20);
    intr.dpdu.super_Tuple3<pbrt::Vector3,_float>.x = this_00[5].high;
    auVar32 = vaddss_avx512f(auVar32,auVar33);
    u[1] = auVar32._0_4_ * 0.5;
    u[0] = u0;
    u[2] = auVar33._0_4_;
    lVar26 = 1;
    auVar58 = ZEXT1264(ZEXT812(0));
    do {
      u0_00 = u[lVar26 + -1];
      fVar42 = u[lVar26];
      fVar43 = this->common->width[1];
      auVar33 = ZEXT416((uint)this->common->width[0]);
      auVar32 = vfmadd231ss_fma(ZEXT416((uint)(u0_00 * fVar43)),auVar33,ZEXT416((uint)(1.0 - u0_00))
                               );
      auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar43 * fVar42)),auVar33,
                                ZEXT416((uint)(1.0 - fVar42)));
      auVar32 = vmaxss_avx(auVar33,auVar32);
      FVar2 = (pSVar27->super_Interaction).pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      FVar3 = (pSVar27->super_Interaction).pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      fVar43 = (pSVar27->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
      FVar4 = (pSVar27->super_Interaction).time;
      auVar33 = vgatherdps_avx512vl(*(undefined4 *)
                                     ((long)&(pSVar27->super_Interaction).pi.
                                             super_Point3<pbrt::Interval>.
                                             super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low +
                                     (long)&((Tuple3<pbrt::Vector3,_float> *)
                                            &pPVar25->super_Tuple3<pbrt::Point3,_float>)->x));
      auVar30 = vgatherdps_avx512vl(*(undefined4 *)
                                     ((long)&(pSVar27->super_Interaction).pi.
                                             super_Point3<pbrt::Interval>.
                                             super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low +
                                     (long)&((Tuple3<pbrt::Vector3,_float> *)
                                            &pPVar25->super_Tuple3<pbrt::Point3,_float>)->x));
      fVar61 = auVar32._0_4_ * 0.5;
      fVar41 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
      fVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
      fVar15 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
      fVar41 = fVar41 * fVar41 + fVar1 * fVar1 + fVar15 * fVar15;
      if (fVar41 < 0.0) {
        local_2e8._0_4_ = u0_00;
        local_288 = ZEXT416((uint)fVar61);
        local_2d8._0_4_ = FVar2;
        local_298._0_4_ = FVar3;
        local_2c8 = auVar33;
        local_2ac = FVar4;
        fVar41 = sqrtf(fVar41);
        auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar33 = local_2c8;
        u0_00 = (Float)local_2e8._0_4_;
        FVar4 = local_2ac;
        fVar61 = (float)local_288._0_4_;
        FVar2 = (Float)local_2d8._0_4_;
        FVar3 = (Float)local_298._0_4_;
      }
      else {
        auVar32 = vsqrtss_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
        fVar41 = auVar32._0_4_;
      }
      auVar32 = vminss_avx(ZEXT416((uint)FVar3),ZEXT416((uint)FVar2));
      auVar44 = ZEXT416((uint)fVar43);
      auVar31 = vminss_avx(auVar44,ZEXT416((uint)FVar4));
      auVar32 = vminss_avx(auVar31,auVar32);
      bVar23 = false;
      if (auVar32._0_4_ - fVar61 <= 0.0) {
        auVar32 = vmaxss_avx(ZEXT416((uint)FVar3),ZEXT416((uint)FVar2));
        auVar31 = vmaxss_avx(auVar44,ZEXT416((uint)FVar4));
        auVar32 = vmaxss_avx(auVar31,auVar32);
        if (0.0 <= fVar61 + auVar32._0_4_) {
          auVar31 = vmaxss_avx(ZEXT416((uint)(fVar41 * tMax)),auVar58._0_16_);
          auVar44 = vminss_avx(ZEXT416((uint)(fVar41 * tMax)),auVar58._0_16_);
          uVar20 = vcmpps_avx512vl(auVar33,auVar30,1);
          uVar28 = vcmpps_avx512vl(auVar30,auVar33,1);
          auVar32 = vpmovm2d_avx512vl(uVar28);
          auVar32 = vpshufd_avx(auVar32,0x4e);
          uVar29 = vpmovd2m_avx512vl(auVar32);
          auVar32 = vblendps_avx(auVar33,auVar30,6);
          auVar33 = vblendps_avx(auVar30,auVar33,6);
          auVar34 = vblendmps_avx512vl(auVar33,auVar32);
          bVar14 = (bool)((byte)uVar20 & 1);
          auVar35._0_4_ = (uint)bVar14 * auVar34._0_4_ | (uint)!bVar14 * auVar30._0_4_;
          bVar14 = (bool)((byte)(uVar20 >> 1) & 1);
          auVar35._4_4_ = (uint)bVar14 * auVar34._4_4_ | (uint)!bVar14 * auVar30._4_4_;
          bVar14 = (bool)((byte)(uVar20 >> 2) & 1);
          auVar35._8_4_ = (uint)bVar14 * auVar34._8_4_ | (uint)!bVar14 * auVar30._8_4_;
          bVar14 = (bool)((byte)(uVar20 >> 3) & 1);
          auVar35._12_4_ = (uint)bVar14 * auVar34._12_4_ | (uint)!bVar14 * auVar30._12_4_;
          auVar32 = vshufpd_avx(auVar32,auVar32,1);
          auVar33 = vshufpd_avx(auVar33,auVar33,1);
          bVar14 = (bool)((byte)uVar29 & 1);
          auVar36._0_4_ = (uint)bVar14 * auVar32._0_4_ | (uint)!bVar14 * auVar33._0_4_;
          bVar14 = (bool)((byte)(uVar29 >> 1) & 1);
          auVar36._4_4_ = (uint)bVar14 * auVar32._4_4_ | (uint)!bVar14 * auVar33._4_4_;
          bVar14 = (bool)((byte)(uVar29 >> 2) & 1);
          auVar36._8_4_ = (uint)bVar14 * auVar32._8_4_ | (uint)!bVar14 * auVar33._8_4_;
          bVar14 = (bool)((byte)(uVar29 >> 3) & 1);
          auVar36._12_4_ = (uint)bVar14 * auVar32._12_4_ | (uint)!bVar14 * auVar33._12_4_;
          uVar20 = vcmpps_avx512vl(auVar35,auVar36,1);
          auVar32 = vblendps_avx(auVar35,auVar36,6);
          auVar33 = vblendps_avx(auVar36,auVar35,6);
          bVar14 = (bool)((byte)uVar20 & 1);
          auVar37._0_4_ = (float)((uint)bVar14 * auVar32._0_4_ | (uint)!bVar14 * auVar33._0_4_);
          bVar14 = (bool)((byte)(uVar20 >> 1) & 1);
          auVar37._4_4_ = (float)((uint)bVar14 * auVar32._4_4_ | (uint)!bVar14 * auVar33._4_4_);
          bVar14 = (bool)((byte)(uVar20 >> 2) & 1);
          auVar37._8_4_ = (float)((uint)bVar14 * auVar32._8_4_ | (uint)!bVar14 * auVar33._8_4_);
          bVar14 = (bool)((byte)(uVar20 >> 3) & 1);
          auVar37._12_4_ = (float)((uint)bVar14 * auVar32._12_4_ | (uint)!bVar14 * auVar33._12_4_);
          auVar55._4_4_ = fVar61;
          auVar55._0_4_ = fVar61;
          auVar55._8_4_ = fVar61;
          auVar55._12_4_ = fVar61;
          auVar32 = vsubps_avx(auVar37,auVar55);
          auVar56._0_4_ = auVar37._0_4_ + fVar61;
          auVar56._4_4_ = auVar37._4_4_ + fVar61;
          auVar56._8_4_ = auVar37._8_4_ + fVar61;
          auVar56._12_4_ = auVar37._12_4_ + fVar61;
          auVar32 = vblendps_avx(auVar32,auVar56,6);
          auVar33 = vshufps_avx(ZEXT416(auVar44._0_4_),ZEXT416(auVar31._0_4_),0x11);
          uVar28 = vcmpps_avx512vl(auVar32,auVar33,2);
          uVar21 = vcmpps_avx512vl(auVar33,auVar32,2);
          auVar32 = vpmovm2d_avx512vl(uVar21);
          auVar33 = vpmovm2d_avx512vl(uVar28);
          auVar32 = vpblendd_avx2(auVar33,auVar32,6);
          uVar28 = vpmovd2m_avx512vl(auVar32);
          pPVar25 = (Point3<float> *)
                    CONCAT44((int)((ulong)pPVar25 >> 0x20),(uint)(ushort)~(ushort)uVar28);
          if ((~(ushort)uVar28 & 0xf) == 0) {
            cp_00.n = 4;
            cp_00.ptr = (Point3<float> *)pSVar27;
            pPVar25 = (Point3<float> *)0x4;
            bVar23 = RecursiveIntersect(this,ray,tMax,cp_00,local_2b8,u0_00,fVar42,depth + -1,si);
            auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
            bVar23 = bVar23 && si == (optional<pbrt::ShapeIntersection> *)0x0;
          }
        }
      }
      if (bVar23) {
        return true;
      }
      lVar26 = lVar26 + 1;
      pSVar27 = (SurfaceInteraction *)
                &(pSVar27->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
    } while (lVar26 == 2);
    if (si != (optional<pbrt::ShapeIntersection> *)0x0) {
      return si->set;
    }
  }
  return false;
}

Assistant:

bool Curve::RecursiveIntersect(const Ray &ray, Float tMax, pstd::span<const Point3f> cp,
                               const Transform &ObjectFromRay, Float u0, Float u1,
                               int depth, pstd::optional<ShapeIntersection> *si) const {
    Float rayLength = Length(ray.d);
    if (depth > 0) {
        // Split curve segment into sub-segments and test for intersection
        pstd::array<Point3f, 7> cpSplit = SubdivideCubicBezier(cp);
        Float u[3] = {u0, (u0 + u1) / 2, u1};
        for (int seg = 0; seg < 2; ++seg) {
            // Check ray against curve segment's bounding box
            Float maxWidth =
                std::max(Lerp(u[seg], common->width[0], common->width[1]),
                         Lerp(u[seg + 1], common->width[0], common->width[1]));
            pstd::span<const Point3f> cps = pstd::MakeConstSpan(&cpSplit[3 * seg], 4);
            Bounds3f curveBounds =
                Union(Bounds3f(cps[0], cps[1]), Bounds3f(cps[2], cps[3]));
            curveBounds = Expand(curveBounds, 0.5f * maxWidth);
            Bounds3f rayBounds(Point3f(0, 0, 0), Point3f(0, 0, Length(ray.d) * tMax));
            if (!Overlaps(rayBounds, curveBounds))
                continue;

            // Recursively test ray-segment intersection
            bool hit = RecursiveIntersect(ray, tMax, cps, ObjectFromRay, u[seg],
                                          u[seg + 1], depth - 1, si);
            if (hit && si == nullptr)
                return true;
        }
        return si ? si->has_value() : false;

    } else {
        // Intersect ray with curve segment
        // Test ray against segment endpoint boundaries
        // Test sample point against tangent perpendicular at curve start
        Float edge = (cp[1].y - cp[0].y) * -cp[0].y + cp[0].x * (cp[0].x - cp[1].x);
        if (edge < 0)
            return false;

        // Test sample point against tangent perpendicular at curve end
        edge = (cp[2].y - cp[3].y) * -cp[3].y + cp[3].x * (cp[3].x - cp[2].x);
        if (edge < 0)
            return false;

        // Find line $w$ that gives minimum distance to sample point
        Vector2f segmentDir = Point2f(cp[3].x, cp[3].y) - Point2f(cp[0].x, cp[0].y);
        Float denom = LengthSquared(segmentDir);
        if (denom == 0)
            return false;
        Float w = Dot(-Vector2f(cp[0].x, cp[0].y), segmentDir) / denom;

        // Compute $u$ coordinate of curve intersection point and _hitWidth_
        Float u = Clamp(Lerp(w, u0, u1), u0, u1);
        Float hitWidth = Lerp(u, common->width[0], common->width[1]);
        Normal3f nHit;
        if (common->type == CurveType::Ribbon) {
            // Scale _hitWidth_ based on ribbon orientation
            if (common->normalAngle == 0)
                nHit = common->n[0];
            else {
                Float sin0 =
                    std::sin((1 - u) * common->normalAngle) * common->invSinNormalAngle;
                Float sin1 =
                    std::sin(u * common->normalAngle) * common->invSinNormalAngle;
                nHit = sin0 * common->n[0] + sin1 * common->n[1];
            }
            hitWidth *= AbsDot(nHit, ray.d) / rayLength;
        }

        // Test intersection point against curve width
        Vector3f dpcdw;
        Point3f pc =
            EvaluateCubicBezier(pstd::span<const Point3f>(cp), Clamp(w, 0, 1), &dpcdw);
        Float ptCurveDist2 = pc.x * pc.x + pc.y * pc.y;
        if (ptCurveDist2 > hitWidth * hitWidth * .25f)
            return false;
        if (pc.z < 0 || pc.z > rayLength * tMax)
            return false;

        if (si != nullptr) {
            // Initialize _ShapeIntersection_ for curve intersection
            // Compute _tHit_ for curve intersection
            // FIXME: this tHit isn't quite right for ribbons...
            Float tHit = pc.z / rayLength;
            if (si->has_value() && tHit > si->value().tHit)
                return false;

            // Initialize _SurfaceInteraction_ _intr_ for curve intersection
            // Compute $v$ coordinate of curve intersection point
            Float ptCurveDist = std::sqrt(ptCurveDist2);
            Float edgeFunc = dpcdw.x * -pc.y + pc.x * dpcdw.y;
            Float v = (edgeFunc > 0) ? 0.5f + ptCurveDist / hitWidth
                                     : 0.5f - ptCurveDist / hitWidth;

            // Compute $\dpdu$ and $\dpdv$ for curve intersection
            Vector3f dpdu, dpdv;
            EvaluateCubicBezier(pstd::MakeConstSpan(common->cpObj), u, &dpdu);
            CHECK_NE(Vector3f(0, 0, 0), dpdu);
            if (common->type == CurveType::Ribbon)
                dpdv = Normalize(Cross(nHit, dpdu)) * hitWidth;
            else {
                // Compute curve $\dpdv$ for flat and cylinder curves
                Vector3f dpduPlane = ObjectFromRay.ApplyInverse(dpdu);
                Vector3f dpdvPlane =
                    Normalize(Vector3f(-dpduPlane.y, dpduPlane.x, 0)) * hitWidth;
                if (common->type == CurveType::Cylinder) {
                    // Rotate _dpdvPlane_ to give cylindrical appearance
                    Float theta = Lerp(v, -90., 90.);
                    Transform rot = Rotate(-theta, dpduPlane);
                    dpdvPlane = rot(dpdvPlane);
                }
                dpdv = ObjectFromRay(dpdvPlane);
            }

            // Compute error bounds for curve intersection
            Vector3f pError(2 * hitWidth, 2 * hitWidth, 2 * hitWidth);

            bool flipNormal =
                common->reverseOrientation ^ common->transformSwapsHandedness;
            Point3fi pi(ray(tHit), pError);
            SurfaceInteraction intr(pi, {u, v}, -ray.d, dpdu, dpdv, Normal3f(),
                                    Normal3f(), ray.time, flipNormal);
            intr = (*common->renderFromObject)(intr);

            *si = ShapeIntersection{intr, tHit};
        }
#ifndef PBRT_IS_GPU_CODE
        ++nCurveHits;
#endif
        return true;
    }
}